

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_impl.hpp
# Opt level: O1

string * toml::detail::format_location_impl
                   (string *__return_storage_ptr__,size_t lnw,string *prev_fname,
                   source_location *loc,string *msg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  string *psVar2;
  ulong uVar3;
  ulong uVar4;
  size_type sVar5;
  size_t sVar6;
  size_t sVar7;
  pointer pbVar8;
  int iVar9;
  ulong uVar10;
  out_of_range *poVar11;
  ulong len;
  ostringstream oss;
  string local_1d8;
  string *local_1b8;
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  __n = (loc->file_name_)._M_string_length;
  if (__n == prev_fname->_M_string_length) {
    if (__n != 0) {
      iVar9 = bcmp((loc->file_name_)._M_dataplus._M_p,(prev_fname->_M_dataplus)._M_p,__n);
      if (iVar9 != 0) goto LAB_0023fa54;
    }
  }
  else {
LAB_0023fa54:
    format_filename((ostringstream *)local_1a8,loc);
    if ((loc->line_str_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (loc->line_str_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      format_empty_line((ostringstream *)local_1a8,lnw);
    }
  }
  psVar2 = (string *)
           (loc->line_str_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(loc->line_str_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 5;
  local_1b0 = __return_storage_ptr__;
  if (uVar10 == 2) {
    local_1b8 = msg;
    if ((string *)
        (loc->line_str_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == psVar2) {
      poVar11 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(poVar11,"toml::source_location::first_line: `lines` is empty")
      ;
    }
    else {
      sVar5 = psVar2->_M_string_length;
      sVar6 = loc->first_offset_;
      format_line((ostringstream *)local_1a8,lnw,loc->first_line_,psVar2);
      sVar7 = loc->first_offset_;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
      format_underline((ostringstream *)local_1a8,lnw,sVar7,(sVar5 - sVar6) + 1,&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      pbVar8 = (loc->line_str_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar8 != (loc->line_str_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        format_line((ostringstream *)local_1a8,lnw,loc->last_line_,(string *)(pbVar8 + -1));
        format_underline((ostringstream *)local_1a8,lnw,1,loc->last_offset_,local_1b8);
        goto LAB_0023fd6c;
      }
      poVar11 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(poVar11,"toml::source_location::first_line: `lines` is empty")
      ;
    }
    __cxa_throw(poVar11,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  if (uVar10 == 1) {
    if ((string *)
        (loc->line_str_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == psVar2) {
      poVar11 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(poVar11,"toml::source_location::first_line: `lines` is empty")
      ;
      __cxa_throw(poVar11,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    uVar10 = psVar2->_M_string_length;
    uVar3 = loc->first_offset_;
    uVar4 = loc->length_;
    format_line((ostringstream *)local_1a8,lnw,loc->first_line_,psVar2);
    len = 1;
    if (uVar3 <= uVar10) {
      len = (uVar10 - uVar3) + 1;
    }
    if (uVar4 < len) {
      len = uVar4;
    }
    format_underline((ostringstream *)local_1a8,lnw,loc->first_offset_,len,msg);
  }
  else if (2 < uVar10) {
    if ((string *)
        (loc->line_str_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == psVar2) {
      poVar11 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(poVar11,"toml::source_location::first_line: `lines` is empty")
      ;
    }
    else {
      sVar5 = psVar2->_M_string_length;
      sVar6 = loc->first_offset_;
      format_line((ostringstream *)local_1a8,lnw,loc->first_line_,psVar2);
      sVar7 = loc->first_offset_;
      paVar1 = &local_1d8.field_2;
      local_1d8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"and","");
      format_underline((ostringstream *)local_1a8,lnw,sVar7,(sVar5 - sVar6) + 1,&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      sVar6 = loc->first_line_;
      pbVar8 = (loc->line_str_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)(loc->line_str_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 == 0x60) {
        format_line((ostringstream *)local_1a8,lnw,sVar6 + 1,(string *)(pbVar8 + 1));
        pbVar8 = (loc->line_str_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(loc->line_str_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) < 2) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
        }
        sVar6 = pbVar8[1]._M_string_length;
        local_1d8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"and","");
        format_underline((ostringstream *)local_1a8,lnw,1,sVar6,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_1d8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8," ...","");
        format_line((ostringstream *)local_1a8,lnw,sVar6 + 1,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        format_empty_line((ostringstream *)local_1a8,lnw);
      }
      pbVar8 = (loc->line_str_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar8 != (loc->line_str_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        format_line((ostringstream *)local_1a8,lnw,loc->last_line_,(string *)(pbVar8 + -1));
        format_underline((ostringstream *)local_1a8,lnw,1,loc->last_offset_,msg);
        goto LAB_0023fd6c;
      }
      poVar11 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(poVar11,"toml::source_location::first_line: `lines` is empty")
      ;
    }
    __cxa_throw(poVar11,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
LAB_0023fd6c:
  psVar2 = local_1b0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

TOML11_INLINE std::string format_location_impl(const std::size_t lnw,
    const std::string& prev_fname,
    const source_location& loc, const std::string& msg)
{
    std::ostringstream oss;

    if(loc.file_name() != prev_fname)
    {
        format_filename(oss, loc);
        if( ! loc.lines().empty())
        {
            format_empty_line(oss, lnw);
        }
    }

    if(loc.lines().size() == 1)
    {
        // when column points LF, it exceeds the size of the first line.
        std::size_t underline_limit = 1;
        if(loc.first_line().size() < loc.first_column_offset())
        {
            underline_limit = 1;
        }
        else
        {
            underline_limit = loc.first_line().size() - loc.first_column_offset() + 1;
        }
        const auto underline_len = (std::min)(underline_limit, loc.length());

        format_line(oss, lnw, loc.first_line_number(), loc.first_line());
        format_underline(oss, lnw, loc.first_column_offset(), underline_len, msg);
    }
    else if(loc.lines().size() == 2)
    {
        const auto first_underline_len =
            loc.first_line().size() - loc.first_column_offset() + 1;
        format_line(oss, lnw, loc.first_line_number(), loc.first_line());
        format_underline(oss, lnw, loc.first_column_offset(),
                first_underline_len, "");

        format_line(oss, lnw, loc.last_line_number(), loc.last_line());
        format_underline(oss, lnw, 1, loc.last_column_offset(), msg);
    }
    else if(loc.lines().size() > 2)
    {
        const auto first_underline_len =
            loc.first_line().size() - loc.first_column_offset() + 1;
        format_line(oss, lnw, loc.first_line_number(), loc.first_line());
        format_underline(oss, lnw, loc.first_column_offset(),
                first_underline_len, "and");

        if(loc.lines().size() == 3)
        {
            format_line(oss, lnw, loc.first_line_number()+1, loc.lines().at(1));
            format_underline(oss, lnw, 1, loc.lines().at(1).size(), "and");
        }
        else
        {
            format_line(oss, lnw, loc.first_line_number()+1, " ...");
            format_empty_line(oss, lnw);
        }
        format_line(oss, lnw, loc.last_line_number(), loc.last_line());
        format_underline(oss, lnw, 1, loc.last_column_offset(), msg);
    }
    // if loc is empty, do nothing.
    return oss.str();
}